

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O2

void __thiscall Ipv4InternalTlv::Print(Ipv4InternalTlv *this,ostream *os)

{
  ostream *poVar1;
  string sStack_48;
  
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"Ipv4 Internal TLV:");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t");
  poVar1 = std::operator<<(poVar1,"type: ");
  poVar1 = std::operator<<(poVar1,"0x0102");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t");
  poVar1 = std::operator<<(poVar1,"length: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(this->super_Tlv).tlen);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t");
  poVar1 = std::operator<<(poVar1,"nexthop: ");
  num2ip_abi_cxx11_(&sStack_48,*(uint32_t *)&(this->super_Tlv).field_0xc);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(os,"\t\t");
  poVar1 = std::operator<<(poVar1,"prefix length: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t");
  poVar1 = std::operator<<(poVar1,"destination: ");
  num2ip_abi_cxx11_(&sStack_48,this->destination);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(os,"\t\t");
  poVar1 = std::operator<<(poVar1,"metric:");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"scaled delay: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"scaled bandwidth: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"mtu: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,"\t\t\t");
  poVar1 = std::operator<<(poVar1,"hop count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void Ipv4InternalTlv::Print(std::ostream& os)
{
    os << '\t' << "Ipv4 Internal TLV:" << '\n';
    os << "\t\t"
       << "type: "
       << "0x0102" << '\n';
    os << "\t\t"
       << "length: " << tlen << '\n';
    os << "\t\t"
       << "nexthop: " << num2ip(nexthop) << '\n';
    os << "\t\t"
       << "prefix length: " << (uint32_t)prefixlen << '\n';
    os << "\t\t"
       << "destination: " << num2ip(destination) << '\n';
    os << "\t\t"
       << "metric:" << '\n';
    os << "\t\t\t"
       << "scaled delay: " << delay << '\n';
    os << "\t\t\t"
       << "scaled bandwidth: " << bandwidth << '\n';
    os << "\t\t\t"
       << "mtu: " << mtu << '\n';
    os << "\t\t\t"
       << "hop count: " << hop_count << '\n';
}